

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O2

void __thiscall
HACD::MyAutoGeometry::addTri
          (MyAutoGeometry *this,SimpleSkinnedVertex *v1,SimpleSkinnedVertex *v2,
          SimpleSkinnedVertex *v3,SimpleBone *sbones)

{
  HaU32 i;
  ulong uVar1;
  HaU32 bcount;
  HaU32 bones [8];
  HaU32 local_5c;
  HaU32 local_58 [10];
  
  local_5c = 0;
  addBones(this,v1,local_58,&local_5c,sbones);
  addBones(this,v2,local_58,&local_5c,sbones);
  addBones(this,v3,local_58,&local_5c,sbones);
  for (uVar1 = 0; uVar1 < local_5c; uVar1 = uVar1 + 1) {
    addPos(this,v1->mPos,local_58[uVar1],sbones);
    addPos(this,v2->mPos,local_58[uVar1],sbones);
    addPos(this,v3->mPos,local_58[uVar1],sbones);
  }
  return;
}

Assistant:

void addTri(const HACD::SimpleSkinnedVertex &v1,const HACD::SimpleSkinnedVertex &v2,const HACD::SimpleSkinnedVertex &v3,const HACD::SimpleBone *sbones)
		{
			hacd::HaU32 bcount = 0;
			hacd::HaU32 bones[MAX_BONE_COUNT];
			addBones(v1,bones,bcount, sbones);
			addBones(v2,bones,bcount, sbones);
			addBones(v3,bones,bcount, sbones);
			for (hacd::HaU32 i=0; i<bcount; i++)
			{
				addPos(v1.mPos, bones[i], sbones );
				addPos(v2.mPos, bones[i], sbones );
				addPos(v3.mPos, bones[i], sbones );
			}
		}